

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O1

content<double> * __thiscall mpt::value_store::reserve<double>(value_store *this,long count)

{
  content<double> *pcVar1;
  
  if ((reserve<double>::traits == (type_traits *)0x0) &&
     (reserve<double>::traits = (type_traits *)mpt::type_traits::get(100),
     reserve<double>::traits == (type_traits *)0x0)) {
    return (content<double> *)0x0;
  }
  pcVar1 = (content<double> *)mpt::value_store::reserve((long)this,(type_traits *)count);
  if (pcVar1 != (content<double> *)0x0) {
    this->_type = 100;
  }
  return pcVar1;
}

Assistant:

content<T> *reserve(long count = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		buffer *buf = reserve(count, *traits);
		if (buf) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<content<T>*>(buf);
	}